

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O2

void Test25(void)

{
  CMReturn In;
  allocator<char> local_222e;
  allocator<char> local_222d;
  _CM_RETURN_STATUS local_222c;
  CMReturn res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21e0;
  undefined1 local_21c0;
  undefined7 uStack_21bf;
  undefined1 uStack_21b8;
  undefined7 uStack_21b7;
  undefined1 uStack_21b0;
  undefined7 uStack_21af;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2190;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2160;
  string in;
  string local_2120;
  string local_2100;
  string local_20e0;
  string local_20c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20a0;
  string local_2080;
  string local_2060;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2040;
  ConfusableMatcher matcher;
  
  GetDefaultMap_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,
             "ASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASB"
             ,(allocator<char> *)&matcher);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2190,&map);
  local_2040._M_buckets = &local_2040._M_single_bucket;
  local_2040._M_bucket_count = 1;
  local_2040._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2040._M_element_count = 0;
  local_2040._M_rehash_policy._M_max_load_factor = 1.0;
  local_2040._M_rehash_policy._4_4_ = 0;
  local_2040._M_rehash_policy._M_next_resize = 0;
  local_2040._M_single_bucket = (__node_base_ptr)0x0;
  ConfusableMatcher::ConfusableMatcher
            (&matcher,&local_2190,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2040,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2040);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2190);
  std::__cxx11::string::string((string *)&local_2060,(string *)&in);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2080,"ASB",(allocator<char> *)&local_21e0);
  local_21c0 = 1;
  uStack_21bf = 0;
  uStack_21b8 = 0;
  uStack_21b7 = 0;
  uStack_21b0 = 0;
  uStack_21af = 0;
  uStack_21a8 = 1;
  local_21a0 = 0;
  uStack_2198 = 0;
  ConfusableMatcher::IndexOf
            (&res,&matcher,&local_2060,&local_2080,
             (CMOptions)ZEXT3248(CONCAT824(1,CONCAT816(0,ZEXT816(1)))));
  std::__cxx11::string::~string((string *)&local_2080);
  std::__cxx11::string::~string((string *)&local_2060);
  local_222c = TIMEOUT;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_20a0,"Test25",&local_222d);
  std::operator+(&local_2160,&local_20a0,": ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_20e0,"TIMEOUT == res.Status",&local_222e);
  cute::cute_to_string::backslashQuoteTabNewline(&local_20c0,&local_20e0);
  std::operator+(&local_21e0,&local_2160,&local_20c0);
  cute::assert_equal<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
            (&local_222c,&res.Status,&local_21e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x28f);
  std::__cxx11::string::~string((string *)&local_21e0);
  std::__cxx11::string::~string((string *)&local_20c0);
  std::__cxx11::string::~string((string *)&local_20e0);
  std::__cxx11::string::~string((string *)&local_2160);
  std::__cxx11::string::~string((string *)&local_20a0);
  std::__cxx11::string::string((string *)&local_2100,(string *)&in);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2120,"ASB",(allocator<char> *)&local_2160);
  ConfusableMatcher::IndexOf
            ((CMReturn *)&local_21e0,&matcher,&local_2100,&local_2120,
             (CMOptions)
             ZEXT3248(CONCAT824(1,CONCAT420(0,CONCAT416(1,CONCAT88(in._M_string_length - 1,1))))));
  res._16_8_ = local_21e0.field_2._M_allocated_capacity;
  res.Start = (uint64_t)local_21e0._M_dataplus._M_p;
  res.Size = local_21e0._M_string_length;
  std::__cxx11::string::~string((string *)&local_2120);
  std::__cxx11::string::~string((string *)&local_2100);
  In.Size = res.Size;
  In.Start = res.Start;
  In.Status = res.Status;
  In._20_4_ = res._20_4_;
  AssertMatch(In,0x5c,3);
  ConfusableMatcher::~ConfusableMatcher(&matcher);
  std::__cxx11::string::~string((string *)&in);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&map);
  return;
}

Assistant:

void Test25()
{
	auto map = GetDefaultMap();

	std::string in = "ASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASB";

	CMOptions opts = { };
	opts.MatchRepeating = true;
	opts.StartFromEnd = false;
	opts.TimeoutNs = 1;
	auto matcher = ConfusableMatcher(map, {});
	auto res = matcher.IndexOf(in, "ASB", opts);
	ASSERT_EQUAL(TIMEOUT, res.Status);

	opts.StartFromEnd = true;
	opts.StartIndex = in.size() - 1;
	res = matcher.IndexOf(in, "ASB", opts);
	AssertMatch(res, 92, 3);
}